

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  Scene *pSVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  NodeRef *pNVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  float fVar29;
  float fVar30;
  float fVar40;
  float fVar42;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar41;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar46;
  float fVar56;
  float fVar57;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar58;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar59;
  float fVar63;
  float fVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar65;
  undefined1 auVar62 [16];
  float fVar66;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar81 [16];
  float fVar82;
  float fVar83;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar84 [16];
  float fVar89;
  float fVar90;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar91 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar118 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  Scene *local_b00;
  undefined1 local_a88 [16];
  undefined1 (*local_a78) [16];
  Scene *local_a70;
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined1 local_848 [16];
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined4 local_828;
  undefined4 uStack_824;
  undefined4 uStack_820;
  undefined4 uStack_81c;
  undefined1 local_818 [16];
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  pNVar24 = stack + 1;
  stack[0] = root;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar80 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar82 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar89 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar106 = fVar80 * 0.99999964;
  fVar115 = fVar82 * 0.99999964;
  fVar95 = fVar89 * 0.99999964;
  fVar80 = fVar80 * 1.0000004;
  fVar82 = fVar82 * 1.0000004;
  fVar89 = fVar89 * 1.0000004;
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar8 = (tray->tnear).field_0.i[k];
  iVar9 = (tray->tfar).field_0.i[k];
  local_a78 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar28 = true;
  do {
    uVar22 = pNVar24[-1].ptr;
    pNVar24 = pNVar24 + -1;
    while ((uVar22 & 8) == 0) {
      pfVar1 = (float *)(uVar22 + 0x20 + uVar25);
      auVar51._0_4_ = (*pfVar1 - fVar5) * fVar106;
      auVar51._4_4_ = (pfVar1[1] - fVar5) * fVar106;
      auVar51._8_4_ = (pfVar1[2] - fVar5) * fVar106;
      auVar51._12_4_ = (pfVar1[3] - fVar5) * fVar106;
      pfVar1 = (float *)(uVar22 + 0x20 + uVar26);
      auVar47._0_4_ = (*pfVar1 - fVar6) * fVar115;
      auVar47._4_4_ = (pfVar1[1] - fVar6) * fVar115;
      auVar47._8_4_ = (pfVar1[2] - fVar6) * fVar115;
      auVar47._12_4_ = (pfVar1[3] - fVar6) * fVar115;
      auVar31 = maxps(auVar51,auVar47);
      pfVar1 = (float *)(uVar22 + 0x20 + uVar27);
      auVar48._0_4_ = (*pfVar1 - fVar7) * fVar95;
      auVar48._4_4_ = (pfVar1[1] - fVar7) * fVar95;
      auVar48._8_4_ = (pfVar1[2] - fVar7) * fVar95;
      auVar48._12_4_ = (pfVar1[3] - fVar7) * fVar95;
      auVar49._4_4_ = iVar8;
      auVar49._0_4_ = iVar8;
      auVar49._8_4_ = iVar8;
      auVar49._12_4_ = iVar8;
      auVar49 = maxps(auVar48,auVar49);
      auVar49 = maxps(auVar31,auVar49);
      pfVar1 = (float *)(uVar22 + 0x20 + (uVar25 ^ 0x10));
      auVar50._0_4_ = (*pfVar1 - fVar5) * fVar80;
      auVar50._4_4_ = (pfVar1[1] - fVar5) * fVar80;
      auVar50._8_4_ = (pfVar1[2] - fVar5) * fVar80;
      auVar50._12_4_ = (pfVar1[3] - fVar5) * fVar80;
      pfVar1 = (float *)(uVar22 + 0x20 + (uVar26 ^ 0x10));
      auVar60._0_4_ = (*pfVar1 - fVar6) * fVar82;
      auVar60._4_4_ = (pfVar1[1] - fVar6) * fVar82;
      auVar60._8_4_ = (pfVar1[2] - fVar6) * fVar82;
      auVar60._12_4_ = (pfVar1[3] - fVar6) * fVar82;
      auVar51 = minps(auVar50,auVar60);
      pfVar1 = (float *)(uVar22 + 0x20 + (uVar27 ^ 0x10));
      auVar61._0_4_ = (*pfVar1 - fVar7) * fVar89;
      auVar61._4_4_ = (pfVar1[1] - fVar7) * fVar89;
      auVar61._8_4_ = (pfVar1[2] - fVar7) * fVar89;
      auVar61._12_4_ = (pfVar1[3] - fVar7) * fVar89;
      auVar31._4_4_ = iVar9;
      auVar31._0_4_ = iVar9;
      auVar31._8_4_ = iVar9;
      auVar31._12_4_ = iVar9;
      auVar31 = minps(auVar61,auVar31);
      auVar31 = minps(auVar51,auVar31);
      auVar32._4_4_ = -(uint)(auVar49._4_4_ <= auVar31._4_4_);
      auVar32._0_4_ = -(uint)(auVar49._0_4_ <= auVar31._0_4_);
      auVar32._8_4_ = -(uint)(auVar49._8_4_ <= auVar31._8_4_);
      auVar32._12_4_ = -(uint)(auVar49._12_4_ <= auVar31._12_4_);
      uVar20 = movmskps((int)root.ptr,auVar32);
      root.ptr = (size_t)uVar20;
      if (uVar20 == 0) goto LAB_002573d6;
      uVar18 = uVar22 & 0xfffffffffffffff0;
      lVar21 = 0;
      if ((byte)uVar20 != 0) {
        for (; ((byte)uVar20 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
        }
      }
      uVar22 = *(ulong *)(uVar18 + lVar21 * 8);
      uVar20 = (uVar20 & 0xff) - 1 & uVar20 & 0xff;
      root.ptr = (size_t)uVar20;
      if (uVar20 != 0) {
        pNVar24->ptr = uVar22;
        pNVar24 = pNVar24 + 1;
        lVar21 = 0;
        if ((Scene *)root.ptr != (Scene *)0x0) {
          for (; (uVar20 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
          }
        }
        uVar22 = *(ulong *)(uVar18 + lVar21 * 8);
        uVar20 = uVar20 - 1 & uVar20;
        uVar23 = (ulong)uVar20;
        if (uVar20 != 0) {
          do {
            pNVar24->ptr = uVar22;
            pNVar24 = pNVar24 + 1;
            root.ptr = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> root.ptr & 1) == 0;
                  root.ptr = (long)&(((Scene *)root.ptr)->super_AccelN).super_Accel.super_AccelData.
                                    super_RefCount._vptr_RefCount + 1) {
              }
            }
            uVar22 = *(ulong *)(uVar18 + root.ptr * 8);
            uVar23 = uVar23 & uVar23 - 1;
          } while (uVar23 != 0);
        }
      }
    }
    pSVar19 = (Scene *)((ulong)((uint)uVar22 & 0xf) - 8);
    if (pSVar19 != (Scene *)0x0) {
      uVar22 = uVar22 & 0xfffffffffffffff0;
      local_b00 = (Scene *)0x0;
      local_a70 = pSVar19;
      do {
        lVar21 = (long)local_b00 * 0xb0;
        fVar45 = *(float *)(ray + k * 4);
        fVar72 = *(float *)(ray + k * 4 + 0x10);
        fVar88 = *(float *)(ray + k * 4 + 0x20);
        pfVar1 = (float *)(uVar22 + lVar21);
        pfVar2 = (float *)(uVar22 + 0x10 + lVar21);
        pfVar3 = (float *)(uVar22 + 0x20 + lVar21);
        pfVar4 = (float *)(uVar22 + 0x30 + lVar21);
        fVar141 = *pfVar1 - fVar45;
        fVar142 = pfVar1[1] - fVar45;
        fVar143 = pfVar1[2] - fVar45;
        fVar144 = pfVar1[3] - fVar45;
        fVar107 = *pfVar2 - fVar72;
        fVar109 = pfVar2[1] - fVar72;
        fVar111 = pfVar2[2] - fVar72;
        fVar113 = pfVar2[3] - fVar72;
        fVar129 = *pfVar3 - fVar88;
        fVar131 = pfVar3[1] - fVar88;
        fVar133 = pfVar3[2] - fVar88;
        fVar135 = pfVar3[3] - fVar88;
        fVar29 = *pfVar4 - fVar45;
        fVar40 = pfVar4[1] - fVar45;
        fVar42 = pfVar4[2] - fVar45;
        fVar44 = pfVar4[3] - fVar45;
        pfVar1 = (float *)(uVar22 + 0x40 + lVar21);
        fVar59 = *pfVar1 - fVar72;
        fVar63 = pfVar1[1] - fVar72;
        fVar64 = pfVar1[2] - fVar72;
        fVar65 = pfVar1[3] - fVar72;
        pfVar1 = (float *)(uVar22 + 0x50 + lVar21);
        fVar76 = *pfVar1 - fVar88;
        fVar77 = pfVar1[1] - fVar88;
        fVar78 = pfVar1[2] - fVar88;
        fVar79 = pfVar1[3] - fVar88;
        pfVar1 = (float *)(uVar22 + 0x60 + lVar21);
        fVar30 = *pfVar1 - fVar45;
        fVar41 = pfVar1[1] - fVar45;
        fVar43 = pfVar1[2] - fVar45;
        fVar45 = pfVar1[3] - fVar45;
        pfVar1 = (float *)(uVar22 + 0x70 + lVar21);
        fVar66 = *pfVar1 - fVar72;
        fVar70 = pfVar1[1] - fVar72;
        fVar71 = pfVar1[2] - fVar72;
        fVar72 = pfVar1[3] - fVar72;
        pfVar1 = (float *)(uVar22 + 0x80 + lVar21);
        fVar83 = *pfVar1 - fVar88;
        fVar85 = pfVar1[1] - fVar88;
        fVar86 = pfVar1[2] - fVar88;
        fVar88 = pfVar1[3] - fVar88;
        fVar96 = fVar30 - fVar141;
        fVar99 = fVar41 - fVar142;
        fVar102 = fVar43 - fVar143;
        fVar104 = fVar45 - fVar144;
        fVar125 = fVar66 - fVar107;
        fVar126 = fVar70 - fVar109;
        fVar127 = fVar71 - fVar111;
        fVar128 = fVar72 - fVar113;
        fVar116 = fVar83 - fVar129;
        fVar119 = fVar85 - fVar131;
        fVar121 = fVar86 - fVar133;
        fVar123 = fVar88 - fVar135;
        fVar87 = *(float *)(ray + k * 4 + 0x50);
        fVar98 = *(float *)(ray + k * 4 + 0x60);
        fVar101 = *(float *)(ray + k * 4 + 0x40);
        fVar137 = (fVar125 * (fVar129 + fVar83) - (fVar107 + fVar66) * fVar116) * fVar101 +
                  ((fVar141 + fVar30) * fVar116 - (fVar129 + fVar83) * fVar96) * fVar87 +
                  (fVar96 * (fVar107 + fVar66) - (fVar141 + fVar30) * fVar125) * fVar98;
        fVar138 = (fVar126 * (fVar131 + fVar85) - (fVar109 + fVar70) * fVar119) * fVar101 +
                  ((fVar142 + fVar41) * fVar119 - (fVar131 + fVar85) * fVar99) * fVar87 +
                  (fVar99 * (fVar109 + fVar70) - (fVar142 + fVar41) * fVar126) * fVar98;
        fVar139 = (fVar127 * (fVar133 + fVar86) - (fVar111 + fVar71) * fVar121) * fVar101 +
                  ((fVar143 + fVar43) * fVar121 - (fVar133 + fVar86) * fVar102) * fVar87 +
                  (fVar102 * (fVar111 + fVar71) - (fVar143 + fVar43) * fVar127) * fVar98;
        fVar140 = (fVar128 * (fVar135 + fVar88) - (fVar113 + fVar72) * fVar123) * fVar101 +
                  ((fVar144 + fVar45) * fVar123 - (fVar135 + fVar88) * fVar104) * fVar87 +
                  (fVar104 * (fVar113 + fVar72) - (fVar144 + fVar45) * fVar128) * fVar98;
        fVar46 = fVar141 - fVar29;
        fVar56 = fVar142 - fVar40;
        fVar57 = fVar143 - fVar42;
        fVar58 = fVar144 - fVar44;
        fVar90 = fVar107 - fVar59;
        fVar92 = fVar109 - fVar63;
        fVar93 = fVar111 - fVar64;
        fVar94 = fVar113 - fVar65;
        fVar117 = fVar129 - fVar76;
        fVar120 = fVar131 - fVar77;
        fVar122 = fVar133 - fVar78;
        fVar124 = fVar135 - fVar79;
        auVar73._0_4_ =
             (fVar90 * (fVar129 + fVar76) - (fVar107 + fVar59) * fVar117) * fVar101 +
             ((fVar141 + fVar29) * fVar117 - (fVar129 + fVar76) * fVar46) * fVar87 +
             (fVar46 * (fVar107 + fVar59) - (fVar141 + fVar29) * fVar90) * fVar98;
        auVar73._4_4_ =
             (fVar92 * (fVar131 + fVar77) - (fVar109 + fVar63) * fVar120) * fVar101 +
             ((fVar142 + fVar40) * fVar120 - (fVar131 + fVar77) * fVar56) * fVar87 +
             (fVar56 * (fVar109 + fVar63) - (fVar142 + fVar40) * fVar92) * fVar98;
        auVar73._8_4_ =
             (fVar93 * (fVar133 + fVar78) - (fVar111 + fVar64) * fVar122) * fVar101 +
             ((fVar143 + fVar42) * fVar122 - (fVar133 + fVar78) * fVar57) * fVar87 +
             (fVar57 * (fVar111 + fVar64) - (fVar143 + fVar42) * fVar93) * fVar98;
        auVar73._12_4_ =
             (fVar94 * (fVar135 + fVar79) - (fVar113 + fVar65) * fVar124) * fVar101 +
             ((fVar144 + fVar44) * fVar124 - (fVar135 + fVar79) * fVar58) * fVar87 +
             (fVar58 * (fVar113 + fVar65) - (fVar144 + fVar44) * fVar94) * fVar98;
        fVar97 = fVar29 - fVar30;
        fVar100 = fVar40 - fVar41;
        fVar103 = fVar42 - fVar43;
        fVar105 = fVar44 - fVar45;
        fVar108 = fVar59 - fVar66;
        fVar110 = fVar63 - fVar70;
        fVar112 = fVar64 - fVar71;
        fVar114 = fVar65 - fVar72;
        fVar130 = fVar76 - fVar83;
        fVar132 = fVar77 - fVar85;
        fVar134 = fVar78 - fVar86;
        fVar136 = fVar79 - fVar88;
        auVar62._0_4_ =
             (fVar108 * (fVar83 + fVar76) - (fVar66 + fVar59) * fVar130) * fVar101 +
             ((fVar30 + fVar29) * fVar130 - (fVar83 + fVar76) * fVar97) * fVar87 +
             (fVar97 * (fVar66 + fVar59) - (fVar30 + fVar29) * fVar108) * fVar98;
        auVar62._4_4_ =
             (fVar110 * (fVar85 + fVar77) - (fVar70 + fVar63) * fVar132) * fVar101 +
             ((fVar41 + fVar40) * fVar132 - (fVar85 + fVar77) * fVar100) * fVar87 +
             (fVar100 * (fVar70 + fVar63) - (fVar41 + fVar40) * fVar110) * fVar98;
        auVar62._8_4_ =
             (fVar112 * (fVar86 + fVar78) - (fVar71 + fVar64) * fVar134) * fVar101 +
             ((fVar43 + fVar42) * fVar134 - (fVar86 + fVar78) * fVar103) * fVar87 +
             (fVar103 * (fVar71 + fVar64) - (fVar43 + fVar42) * fVar112) * fVar98;
        auVar62._12_4_ =
             (fVar114 * (fVar88 + fVar79) - (fVar72 + fVar65) * fVar136) * fVar101 +
             ((fVar45 + fVar44) * fVar136 - (fVar88 + fVar79) * fVar105) * fVar87 +
             (fVar105 * (fVar72 + fVar65) - (fVar45 + fVar44) * fVar114) * fVar98;
        fVar30 = auVar73._0_4_ + fVar137 + auVar62._0_4_;
        fVar40 = auVar73._4_4_ + fVar138 + auVar62._4_4_;
        fVar41 = auVar73._8_4_ + fVar139 + auVar62._8_4_;
        fVar42 = auVar73._12_4_ + fVar140 + auVar62._12_4_;
        auVar33._4_4_ = fVar138;
        auVar33._0_4_ = fVar137;
        auVar33._8_4_ = fVar139;
        auVar33._12_4_ = fVar140;
        auVar49 = minps(auVar33,auVar73);
        auVar49 = minps(auVar49,auVar62);
        auVar67._4_4_ = fVar138;
        auVar67._0_4_ = fVar137;
        auVar67._8_4_ = fVar139;
        auVar67._12_4_ = fVar140;
        auVar31 = maxps(auVar67,auVar73);
        auVar31 = maxps(auVar31,auVar62);
        fVar45 = ABS(fVar30) * 1.1920929e-07;
        fVar72 = ABS(fVar40) * 1.1920929e-07;
        fVar88 = ABS(fVar41) * 1.1920929e-07;
        fVar29 = ABS(fVar42) * 1.1920929e-07;
        auVar68._4_4_ = -(uint)(auVar31._4_4_ <= fVar72);
        auVar68._0_4_ = -(uint)(auVar31._0_4_ <= fVar45);
        auVar68._8_4_ = -(uint)(auVar31._8_4_ <= fVar88);
        auVar68._12_4_ = -(uint)(auVar31._12_4_ <= fVar29);
        auVar34._4_4_ = -(uint)(-fVar72 <= auVar49._4_4_);
        auVar34._0_4_ = -(uint)(-fVar45 <= auVar49._0_4_);
        auVar34._8_4_ = -(uint)(-fVar88 <= auVar49._8_4_);
        auVar34._12_4_ = -(uint)(-fVar29 <= auVar49._12_4_);
        auVar68 = auVar68 | auVar34;
        uVar20 = movmskps((int)pSVar19,auVar68);
        pSVar19 = (Scene *)(ulong)uVar20;
        if (uVar20 != 0) {
          auVar91._0_4_ = fVar90 * fVar130 - fVar117 * fVar108;
          auVar91._4_4_ = fVar92 * fVar132 - fVar120 * fVar110;
          auVar91._8_4_ = fVar93 * fVar134 - fVar122 * fVar112;
          auVar91._12_4_ = fVar94 * fVar136 - fVar124 * fVar114;
          auVar35._4_4_ = -(uint)(ABS(fVar92 * fVar119) < ABS(fVar120 * fVar110));
          auVar35._0_4_ = -(uint)(ABS(fVar90 * fVar116) < ABS(fVar117 * fVar108));
          auVar35._8_4_ = -(uint)(ABS(fVar93 * fVar121) < ABS(fVar122 * fVar112));
          auVar35._12_4_ = -(uint)(ABS(fVar94 * fVar123) < ABS(fVar124 * fVar114));
          auVar16._4_4_ = fVar126 * fVar120 - fVar92 * fVar119;
          auVar16._0_4_ = fVar125 * fVar117 - fVar90 * fVar116;
          auVar16._8_4_ = fVar127 * fVar122 - fVar93 * fVar121;
          auVar16._12_4_ = fVar128 * fVar124 - fVar94 * fVar123;
          local_898 = blendvps(auVar91,auVar16,auVar35);
          auVar118._0_4_ = fVar117 * fVar97 - fVar46 * fVar130;
          auVar118._4_4_ = fVar120 * fVar100 - fVar56 * fVar132;
          auVar118._8_4_ = fVar122 * fVar103 - fVar57 * fVar134;
          auVar118._12_4_ = fVar124 * fVar105 - fVar58 * fVar136;
          auVar36._4_4_ = -(uint)(ABS(fVar120 * fVar99) < ABS(fVar56 * fVar132));
          auVar36._0_4_ = -(uint)(ABS(fVar117 * fVar96) < ABS(fVar46 * fVar130));
          auVar36._8_4_ = -(uint)(ABS(fVar122 * fVar102) < ABS(fVar57 * fVar134));
          auVar36._12_4_ = -(uint)(ABS(fVar124 * fVar104) < ABS(fVar58 * fVar136));
          auVar15._4_4_ = fVar119 * fVar56 - fVar120 * fVar99;
          auVar15._0_4_ = fVar116 * fVar46 - fVar117 * fVar96;
          auVar15._8_4_ = fVar121 * fVar57 - fVar122 * fVar102;
          auVar15._12_4_ = fVar123 * fVar58 - fVar124 * fVar104;
          local_888 = blendvps(auVar118,auVar15,auVar36);
          auVar74._0_4_ = fVar96 * fVar90 - fVar46 * fVar125;
          auVar74._4_4_ = fVar99 * fVar92 - fVar56 * fVar126;
          auVar74._8_4_ = fVar102 * fVar93 - fVar57 * fVar127;
          auVar74._12_4_ = fVar104 * fVar94 - fVar58 * fVar128;
          auVar81._0_4_ = fVar46 * fVar108 - fVar90 * fVar97;
          auVar81._4_4_ = fVar56 * fVar110 - fVar92 * fVar100;
          auVar81._8_4_ = fVar57 * fVar112 - fVar93 * fVar103;
          auVar81._12_4_ = fVar58 * fVar114 - fVar94 * fVar105;
          auVar37._4_4_ = -(uint)(ABS(fVar56 * fVar126) < ABS(fVar92 * fVar100));
          auVar37._0_4_ = -(uint)(ABS(fVar46 * fVar125) < ABS(fVar90 * fVar97));
          auVar37._8_4_ = -(uint)(ABS(fVar57 * fVar127) < ABS(fVar93 * fVar103));
          auVar37._12_4_ = -(uint)(ABS(fVar58 * fVar128) < ABS(fVar94 * fVar105));
          local_878 = blendvps(auVar81,auVar74,auVar37);
          fVar44 = fVar101 * local_898._0_4_ + fVar87 * local_888._0_4_ + fVar98 * local_878._0_4_;
          fVar46 = fVar101 * local_898._4_4_ + fVar87 * local_888._4_4_ + fVar98 * local_878._4_4_;
          fVar56 = fVar101 * local_898._8_4_ + fVar87 * local_888._8_4_ + fVar98 * local_878._8_4_;
          fVar57 = fVar101 * local_898._12_4_ +
                   fVar87 * local_888._12_4_ + fVar98 * local_878._12_4_;
          fVar44 = fVar44 + fVar44;
          fVar46 = fVar46 + fVar46;
          fVar56 = fVar56 + fVar56;
          fVar57 = fVar57 + fVar57;
          auVar52._0_4_ = fVar129 * local_878._0_4_;
          auVar52._4_4_ = fVar131 * local_878._4_4_;
          auVar52._8_4_ = fVar133 * local_878._8_4_;
          auVar52._12_4_ = fVar135 * local_878._12_4_;
          fVar98 = fVar141 * local_898._0_4_ + fVar107 * local_888._0_4_ + auVar52._0_4_;
          fVar101 = fVar142 * local_898._4_4_ + fVar109 * local_888._4_4_ + auVar52._4_4_;
          fVar29 = fVar143 * local_898._8_4_ + fVar111 * local_888._8_4_ + auVar52._8_4_;
          fVar43 = fVar144 * local_898._12_4_ + fVar113 * local_888._12_4_ + auVar52._12_4_;
          auVar14._4_4_ = fVar46;
          auVar14._0_4_ = fVar44;
          auVar14._8_4_ = fVar56;
          auVar14._12_4_ = fVar57;
          auVar49 = rcpps(auVar52,auVar14);
          fVar45 = auVar49._0_4_;
          fVar72 = auVar49._4_4_;
          fVar88 = auVar49._8_4_;
          fVar87 = auVar49._12_4_;
          local_8a8._0_4_ = ((1.0 - fVar44 * fVar45) * fVar45 + fVar45) * (fVar98 + fVar98);
          local_8a8._4_4_ = ((1.0 - fVar46 * fVar72) * fVar72 + fVar72) * (fVar101 + fVar101);
          local_8a8._8_4_ = ((1.0 - fVar56 * fVar88) * fVar88 + fVar88) * (fVar29 + fVar29);
          local_8a8._12_4_ = ((1.0 - fVar57 * fVar87) * fVar87 + fVar87) * (fVar43 + fVar43);
          fVar45 = *(float *)(ray + k * 4 + 0x80);
          fVar72 = *(float *)(ray + k * 4 + 0x30);
          auVar53._0_4_ =
               -(uint)(local_8a8._0_4_ <= fVar45 && fVar72 <= local_8a8._0_4_) & auVar68._0_4_;
          auVar53._4_4_ =
               -(uint)(local_8a8._4_4_ <= fVar45 && fVar72 <= local_8a8._4_4_) & auVar68._4_4_;
          auVar53._8_4_ =
               -(uint)(local_8a8._8_4_ <= fVar45 && fVar72 <= local_8a8._8_4_) & auVar68._8_4_;
          auVar53._12_4_ =
               -(uint)(local_8a8._12_4_ <= fVar45 && fVar72 <= local_8a8._12_4_) & auVar68._12_4_;
          uVar20 = movmskps(uVar20,auVar53);
          pSVar19 = (Scene *)(ulong)uVar20;
          if (uVar20 != 0) {
            auVar54._0_4_ = auVar53._0_4_ & -(uint)(fVar44 != 0.0);
            auVar54._4_4_ = auVar53._4_4_ & -(uint)(fVar46 != 0.0);
            auVar54._8_4_ = auVar53._8_4_ & -(uint)(fVar56 != 0.0);
            auVar54._12_4_ = auVar53._12_4_ & -(uint)(fVar57 != 0.0);
            uVar20 = movmskps(uVar20,auVar54);
            pSVar19 = (Scene *)(ulong)uVar20;
            if (uVar20 != 0) {
              auVar17._4_4_ = fVar40;
              auVar17._0_4_ = fVar30;
              auVar17._8_4_ = fVar41;
              auVar17._12_4_ = fVar42;
              pSVar19 = context->scene;
              auVar49 = rcpps(local_8a8,auVar17);
              fVar72 = auVar49._0_4_;
              fVar88 = auVar49._4_4_;
              fVar87 = auVar49._8_4_;
              fVar98 = auVar49._12_4_;
              fVar72 = (float)(-(uint)(1e-18 <= ABS(fVar30)) &
                              (uint)(((float)DAT_01f7ba10 - fVar30 * fVar72) * fVar72 + fVar72));
              fVar88 = (float)(-(uint)(1e-18 <= ABS(fVar40)) &
                              (uint)((DAT_01f7ba10._4_4_ - fVar40 * fVar88) * fVar88 + fVar88));
              fVar87 = (float)(-(uint)(1e-18 <= ABS(fVar41)) &
                              (uint)((DAT_01f7ba10._8_4_ - fVar41 * fVar87) * fVar87 + fVar87));
              fVar98 = (float)(-(uint)(1e-18 <= ABS(fVar42)) &
                              (uint)((DAT_01f7ba10._12_4_ - fVar42 * fVar98) * fVar98 + fVar98));
              auVar75._0_4_ = fVar137 * fVar72;
              auVar75._4_4_ = fVar138 * fVar88;
              auVar75._8_4_ = fVar139 * fVar87;
              auVar75._12_4_ = fVar140 * fVar98;
              local_8c8 = minps(auVar75,_DAT_01f7ba10);
              auVar84._0_4_ = fVar72 * auVar73._0_4_;
              auVar84._4_4_ = fVar88 * auVar73._4_4_;
              auVar84._8_4_ = fVar87 * auVar73._8_4_;
              auVar84._12_4_ = fVar98 * auVar73._12_4_;
              local_8b8 = minps(auVar84,_DAT_01f7ba10);
              uVar18 = (ulong)(byte)uVar20;
              do {
                uVar23 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                  }
                }
                local_808 = *(uint *)(lVar21 + uVar22 + 0x90 + uVar23 * 4);
                pGVar12 = (pSVar19->geometries).items[local_808].ptr;
                if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_002573ec:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar28;
                  }
                  local_838 = *(undefined4 *)(local_8c8 + uVar23 * 4);
                  local_828 = *(undefined4 *)(local_8b8 + uVar23 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar23 * 4);
                  args.context = context->user;
                  uVar11 = *(undefined4 *)(lVar21 + uVar22 + 0xa0 + uVar23 * 4);
                  auVar69._4_4_ = uVar11;
                  auVar69._0_4_ = uVar11;
                  auVar69._8_4_ = uVar11;
                  auVar69._12_4_ = uVar11;
                  uVar11 = *(undefined4 *)(local_898 + uVar23 * 4);
                  local_858 = *(undefined4 *)(local_888 + uVar23 * 4);
                  uVar10 = *(undefined4 *)(local_878 + uVar23 * 4);
                  local_848._4_4_ = uVar10;
                  local_848._0_4_ = uVar10;
                  local_848._8_4_ = uVar10;
                  local_848._12_4_ = uVar10;
                  local_868[0] = (RTCHitN)(char)uVar11;
                  local_868[1] = (RTCHitN)(char)((uint)uVar11 >> 8);
                  local_868[2] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
                  local_868[3] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
                  local_868[4] = (RTCHitN)(char)uVar11;
                  local_868[5] = (RTCHitN)(char)((uint)uVar11 >> 8);
                  local_868[6] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
                  local_868[7] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
                  local_868[8] = (RTCHitN)(char)uVar11;
                  local_868[9] = (RTCHitN)(char)((uint)uVar11 >> 8);
                  local_868[10] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
                  local_868[0xb] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
                  local_868[0xc] = (RTCHitN)(char)uVar11;
                  local_868[0xd] = (RTCHitN)(char)((uint)uVar11 >> 8);
                  local_868[0xe] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
                  local_868[0xf] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
                  uStack_854 = local_858;
                  uStack_850 = local_858;
                  uStack_84c = local_858;
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  uStack_824 = local_828;
                  uStack_820 = local_828;
                  uStack_81c = local_828;
                  local_818 = auVar69;
                  uStack_804 = local_808;
                  uStack_800 = local_808;
                  uStack_7fc = local_808;
                  uStack_7f4 = (args.context)->instID[0];
                  local_7f8 = uStack_7f4;
                  uStack_7f0 = uStack_7f4;
                  uStack_7ec = uStack_7f4;
                  uStack_7e4 = (args.context)->instPrimID[0];
                  local_7e8 = uStack_7e4;
                  uStack_7e0 = uStack_7e4;
                  uStack_7dc = uStack_7e4;
                  local_a88 = *local_a78;
                  args.valid = (int *)local_a88;
                  args.geometryUserPtr = pGVar12->userPtr;
                  args.hit = local_868;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar12->occlusionFilterN)(&args);
                  }
                  auVar55._8_4_ = 0xffffffff;
                  auVar55._0_8_ = 0xffffffffffffffff;
                  auVar55._12_4_ = 0xffffffff;
                  if (local_a88 == (undefined1  [16])0x0) {
                    auVar39._8_4_ = 0xffffffff;
                    auVar39._0_8_ = 0xffffffffffffffff;
                    auVar39._12_4_ = 0xffffffff;
                    auVar55 = auVar39 ^ auVar55;
                    auVar49 = pmovsxbd(auVar69,0x1010101);
                  }
                  else {
                    p_Var13 = context->args->filter;
                    auVar49 = pmovsxbd(auVar69,0x1010101);
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&args);
                      auVar49 = pmovsxbd(auVar49,0x1010101);
                      auVar55._8_4_ = 0xffffffff;
                      auVar55._0_8_ = 0xffffffffffffffff;
                      auVar55._12_4_ = 0xffffffff;
                    }
                    auVar38._0_4_ = -(uint)(local_a88._0_4_ == 0);
                    auVar38._4_4_ = -(uint)(local_a88._4_4_ == 0);
                    auVar38._8_4_ = -(uint)(local_a88._8_4_ == 0);
                    auVar38._12_4_ = -(uint)(local_a88._12_4_ == 0);
                    auVar55 = auVar38 ^ auVar55;
                    auVar31 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar38
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar31;
                  }
                  if ((auVar49 & auVar55) != (undefined1  [16])0x0) goto LAB_002573ec;
                  *(float *)(ray + k * 4 + 0x80) = fVar45;
                }
                uVar18 = uVar18 ^ 1L << (uVar23 & 0x3f);
              } while (uVar18 != 0);
            }
          }
        }
        root.ptr = (long)&(local_b00->super_AccelN).super_Accel.super_AccelData.super_RefCount.
                          _vptr_RefCount + 1;
        local_b00 = (Scene *)root.ptr;
      } while ((Scene *)root.ptr != local_a70);
    }
LAB_002573d6:
    bVar28 = pNVar24 != stack;
    if (!bVar28) {
      return bVar28;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }